

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

void __thiscall
Protocol::MQTT::V5::PropertiesView::dump(PropertiesView *this,FastString *out,int indent)

{
  bool bVar1;
  uint32 uVar2;
  undefined4 in_register_00000014;
  VisitorVariant *pVVar3;
  undefined8 uVar4;
  VisitorVariant visitor;
  VisitorVariant local_90;
  String local_40;
  
  MQTTStringPrintf((char *)&local_90,"%*sProperties with length ",
                   CONCAT44(in_register_00000014,indent),"");
  Bstrlib::String::operator+=(out,(String *)&local_90);
  Bstrlib::String::~String((String *)&local_90);
  Common::VBInt::dump(&this->length,out,0);
  uVar2 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
  if (uVar2 != 0) {
    local_90.type = 7;
    local_90.propType = BadProperty;
    local_90.offset = 0;
    while( true ) {
      bVar1 = getProperty(this,&local_90);
      if (!bVar1) break;
      if (((byte)local_90.propType < 0x2b) &&
         ((0x16811f4f1U >> (ulong)(local_90.propType & 0x3f) & 1) == 0)) {
        uVar4 = *(undefined8 *)
                 (PrivateRegistry::getPropertyName(unsigned_char)::propertyMap +
                 (ulong)(byte)PrivateRegistry::invPropertyMap[local_90.propType & 0x3f] * 8);
      }
      else {
        uVar4 = 0;
      }
      MQTTStringPrintf((char *)&local_40,"%*sType %s\n",(ulong)(indent + 2),"",uVar4);
      Bstrlib::String::operator+=(out,&local_40);
      Bstrlib::String::~String(&local_40);
      if (local_90.type < 7) {
        pVVar3 = &local_90;
        switch(local_90.type) {
        case '\x04':
        case '\x05':
        case '\x06':
          pVVar3 = (VisitorVariant *)(local_90.buffer + 8);
        }
        (**(code **)(*(long *)pVVar3->buffer + 8))(pVVar3,out,indent + 4);
      }
    }
  }
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sProperties with length ", (int)indent, ""); length.dump(out, 0);
                    if (!(uint32)length) return;
                    VisitorVariant visitor;
                    while (getProperty(visitor))
                    {
                        out += MQTTStringPrintf("%*sType %s\n", indent+2, "", PrivateRegistry::getPropertyName(visitor.propertyType()));
                        visitor.dump(out, indent + 4);
                    }
                }